

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

void Js::CrossSite::MarshalCrossSite_TTDInflate(DynamicObject *obj)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  ScriptContext *pSVar4;
  JavascriptLibrary *pJVar5;
  JavascriptFunction *pJVar6;
  undefined4 *puVar7;
  DynamicTypeHandler *this;
  JavascriptFunction *function;
  DynamicObject *obj_local;
  
  (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x62])();
  TVar3 = RecyclableObject::GetTypeId(&obj->super_RecyclableObject);
  if (TVar3 == TypeIds_Function) {
    pSVar4 = RecyclableObject::GetScriptContext(&obj->super_RecyclableObject);
    pJVar5 = ScriptContext::GetLibrary(pSVar4);
    pJVar6 = JavascriptLibrary::GetDefaultAccessorFunction(pJVar5);
    if ((JavascriptFunction *)obj == pJVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0xcf,
                                  "(obj != obj->GetScriptContext()->GetLibrary()->GetDefaultAccessorFunction())"
                                  ,
                                  "default accessor marshalled -- I don\'t think this should ever happen as it is marshalled in a special case?"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pJVar6 = VarTo<Js::JavascriptFunction,Js::DynamicObject>(obj);
    this = DynamicObject::GetTypeHandler(&pJVar6->super_DynamicObject);
    bVar2 = DynamicTypeHandler::GetIsLocked(this);
    if (bVar2) {
      pJVar5 = RecyclableObject::GetLibrary((RecyclableObject *)pJVar6);
      JavascriptLibrary::SetCrossSiteForLockedFunctionType(pJVar5,pJVar6);
    }
    else {
      pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)pJVar6);
      JavascriptFunction::SetEntryPoint(pJVar6,pSVar4->CurrentCrossSiteThunk);
    }
  }
  return;
}

Assistant:

void CrossSite::MarshalCrossSite_TTDInflate(DynamicObject* obj)
    {
        obj->MarshalCrossSite_TTDInflate();

        if(obj->GetTypeId() == TypeIds_Function)
        {
            AssertMsg(obj != obj->GetScriptContext()->GetLibrary()->GetDefaultAccessorFunction(), "default accessor marshalled -- I don't think this should ever happen as it is marshalled in a special case?");
            JavascriptFunction * function = VarTo<JavascriptFunction>(obj);

            //
            //TODO: what happens if the gaurd in marshal (MarshalDynamicObject) isn't true?
            //

            if(function->GetTypeHandler()->GetIsLocked())
            {
                function->GetLibrary()->SetCrossSiteForLockedFunctionType(function);
            }
            else
            {
                function->SetEntryPoint(function->GetScriptContext()->CurrentCrossSiteThunk);
            }
        }
    }